

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  Mat max;
  Mat sum;
  void *ptr;
  void *local_f8;
  int iStack_bc;
  void *local_b0;
  Mat local_a8;
  ulong local_68;
  void *local_60;
  void *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar9 = bottom_top_blob->dims;
  if (uVar9 == 1) {
    iVar10 = bottom_top_blob->w;
    lVar22 = (long)iVar10;
    pvVar13 = bottom_top_blob->data;
    fVar24 = -3.4028235e+38;
    if (0 < lVar22) {
      lVar11 = 0;
      do {
        fVar27 = *(float *)((long)pvVar13 + lVar11 * 4);
        if (fVar24 <= fVar27) {
          fVar24 = fVar27;
        }
        lVar11 = lVar11 + 1;
      } while (lVar22 != lVar11);
    }
    fVar27 = 0.0;
    if (0 < iVar10) {
      lVar11 = 0;
      do {
        fVar23 = expf(*(float *)((long)pvVar13 + lVar11 * 4) - fVar24);
        *(float *)((long)pvVar13 + lVar11 * 4) = fVar23;
        fVar27 = fVar27 + fVar23;
        lVar11 = lVar11 + 1;
      } while (lVar22 != lVar11);
    }
    if (0 < iVar10) {
      lVar11 = 0;
      do {
        *(float *)((long)pvVar13 + lVar11 * 4) =
             *(float *)((long)pvVar13 + lVar11 * 4) * (1.0 / fVar27);
        lVar11 = lVar11 + 1;
      } while (lVar22 != lVar11);
      return 0;
    }
LAB_0015519e:
    iVar20 = 0;
  }
  else {
    sVar2 = bottom_top_blob->elemsize;
    uVar18 = this->axis;
    if ((uVar9 ^ 2) == 0 && uVar18 == 0) {
      uVar9 = bottom_top_blob->w;
      uVar12 = (ulong)uVar9;
      uVar18 = bottom_top_blob->h;
      uVar19 = (ulong)uVar18;
      pAVar3 = opt->workspace_allocator;
      iStack_bc = (int)uVar9 >> 0x1f;
      local_f8 = (void *)0x0;
      piVar1 = (int *)0x0;
      if (uVar9 != 0) {
        uVar15 = sVar2 * (long)(int)uVar9 + 3 & 0xfffffffffffffffc;
        if (pAVar3 == (Allocator *)0x0) {
          local_a8.data = (void *)0x0;
          iVar10 = posix_memalign(&local_a8.data,0x10,uVar15 + 4);
          local_f8 = local_a8.data;
          if (iVar10 != 0) {
            local_a8.data = (void *)0x0;
            local_f8 = local_a8.data;
          }
        }
        else {
          local_f8 = (void *)(**(code **)(*(long *)pAVar3 + 0x10))();
        }
        piVar1 = (int *)((long)local_f8 + uVar15);
        *(undefined4 *)((long)local_f8 + uVar15) = 1;
      }
      auVar8 = _DAT_0017b770;
      auVar7 = _DAT_0017b760;
      auVar6 = _DAT_0017aef0;
      iVar20 = -100;
      if ((local_f8 != (void *)0x0) && (uVar9 != 0)) {
        if (0 < (int)uVar9) {
          lVar22 = (ulong)uVar9 - 1;
          auVar25._8_4_ = (int)lVar22;
          auVar25._0_8_ = lVar22;
          auVar25._12_4_ = (int)((ulong)lVar22 >> 0x20);
          uVar15 = 0;
          auVar25 = auVar25 ^ _DAT_0017aef0;
          do {
            auVar28._8_4_ = (int)uVar15;
            auVar28._0_8_ = uVar15;
            auVar28._12_4_ = (int)(uVar15 >> 0x20);
            auVar31 = (auVar28 | auVar8) ^ auVar6;
            iVar10 = auVar25._4_4_;
            if ((bool)(~(auVar31._4_4_ == iVar10 && auVar25._0_4_ < auVar31._0_4_ ||
                        iVar10 < auVar31._4_4_) & 1)) {
              *(undefined4 *)((long)local_f8 + uVar15 * 4) = 0xff7fffff;
            }
            if ((auVar31._12_4_ != auVar25._12_4_ || auVar31._8_4_ <= auVar25._8_4_) &&
                auVar31._12_4_ <= auVar25._12_4_) {
              *(undefined4 *)((long)local_f8 + uVar15 * 4 + 4) = 0xff7fffff;
            }
            auVar31 = (auVar28 | auVar7) ^ auVar6;
            iVar20 = auVar31._4_4_;
            if (iVar20 <= iVar10 && (iVar20 != iVar10 || auVar31._0_4_ <= auVar25._0_4_)) {
              *(undefined4 *)((long)local_f8 + uVar15 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)((long)local_f8 + uVar15 * 4 + 0xc) = 0xff7fffff;
            }
            uVar15 = uVar15 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar15);
        }
        if (0 < (int)uVar18) {
          pvVar13 = bottom_top_blob->data;
          iVar10 = bottom_top_blob->w;
          sVar4 = bottom_top_blob->elemsize;
          uVar15 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar17 = 0;
              do {
                fVar27 = *(float *)((long)pvVar13 + uVar17 * 4);
                fVar24 = *(float *)((long)local_f8 + uVar17 * 4);
                if (fVar27 <= fVar24) {
                  fVar27 = fVar24;
                }
                *(float *)((long)local_f8 + uVar17 * 4) = fVar27;
                uVar17 = uVar17 + 1;
              } while (uVar12 != uVar17);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar10 * sVar4);
          } while (uVar15 != uVar19);
        }
        local_a8.allocator = opt->workspace_allocator;
        local_a8.data = (void *)0x0;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.refcount = (int *)0x0;
        local_a8.elempack = 1;
        local_a8.dims = 1;
        local_a8.h = 1;
        local_a8.c = 1;
        local_a8.elemsize = sVar2;
        local_a8.w = uVar9;
        local_a8.cstep._0_4_ = uVar9;
        local_a8.cstep._4_4_ = iStack_bc;
        if (uVar9 != 0) {
          uVar15 = sVar2 * (long)(int)uVar9 + 3 & 0xfffffffffffffffc;
          if (local_a8.allocator == (Allocator *)0x0) {
            local_60 = (void *)0x0;
            iVar10 = posix_memalign(&local_60,0x10,uVar15 + 4);
            local_a8.data = local_60;
            if (iVar10 != 0) {
              local_60 = (void *)0x0;
              local_a8.data = local_60;
            }
          }
          else {
            local_a8.data =
                 (void *)(**(code **)(*(long *)local_a8.allocator + 0x10))(local_a8.allocator);
          }
          local_a8.refcount = (int *)((long)local_a8.data + uVar15);
          *(undefined4 *)((long)local_a8.data + uVar15) = 1;
        }
        pvVar13 = local_a8.data;
        iVar20 = -100;
        if ((local_a8.data != (void *)0x0) &&
           ((long)local_a8.c * CONCAT44(local_a8.cstep._4_4_,(uint)local_a8.cstep) != 0)) {
          if (0 < (int)(local_a8.c * (uint)local_a8.cstep)) {
            memset(local_a8.data,0,(ulong)(local_a8.c * (uint)local_a8.cstep) << 2);
          }
          if (0 < (int)uVar18) {
            pvVar16 = bottom_top_blob->data;
            iVar10 = bottom_top_blob->w;
            sVar2 = bottom_top_blob->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar9) {
                uVar17 = 0;
                do {
                  fVar24 = expf(*(float *)((long)pvVar16 + uVar17 * 4) -
                                *(float *)((long)local_f8 + uVar17 * 4));
                  *(float *)((long)pvVar16 + uVar17 * 4) = fVar24;
                  *(float *)((long)pvVar13 + uVar17 * 4) =
                       fVar24 + *(float *)((long)pvVar13 + uVar17 * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
              }
              uVar15 = uVar15 + 1;
              pvVar16 = (void *)((long)pvVar16 + (long)iVar10 * sVar2);
            } while (uVar15 != uVar19);
          }
          if ((int)uVar18 < 1) {
            iVar20 = 0;
          }
          else {
            pvVar16 = bottom_top_blob->data;
            iVar10 = bottom_top_blob->w;
            sVar2 = bottom_top_blob->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar9) {
                uVar17 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar17 * 4) =
                       *(float *)((long)pvVar16 + uVar17 * 4) /
                       *(float *)((long)pvVar13 + uVar17 * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
              }
              uVar15 = uVar15 + 1;
              pvVar16 = (void *)((long)pvVar16 + (long)iVar10 * sVar2);
            } while (uVar15 != uVar19);
            iVar20 = 0;
          }
        }
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              if (local_a8.data != (void *)0x0) {
                free(local_a8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a8.allocator + 0x18))();
            }
          }
        }
        local_a8.elemsize = 0;
        local_a8.elempack = 0;
        local_a8.data = (void *)0x0;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.dims = 0;
        local_a8.w = 0;
        local_a8.h = 0;
        local_a8.c = 0;
        local_a8.cstep._0_4_ = 0;
        local_a8.cstep._4_4_ = 0;
      }
      if (piVar1 == (int *)0x0) {
        return iVar20;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return iVar20;
      }
      if (pAVar3 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar3 + 0x18))();
        return iVar20;
      }
    }
    else {
      if ((uVar9 ^ 2) == 0 && (uVar18 ^ 1) == 0) {
        iVar10 = bottom_top_blob->h;
        if (0 < (long)iVar10) {
          uVar9 = bottom_top_blob->w;
          uVar19 = (ulong)uVar9;
          pvVar13 = bottom_top_blob->data;
          lVar22 = 0;
          do {
            fVar24 = -3.4028235e+38;
            if (0 < (int)uVar9) {
              uVar12 = 0;
              fVar24 = -3.4028235e+38;
              do {
                fVar27 = *(float *)((long)pvVar13 + uVar12 * 4);
                if (fVar24 <= fVar27) {
                  fVar24 = fVar27;
                }
                uVar12 = uVar12 + 1;
              } while (uVar19 != uVar12);
            }
            fVar27 = 0.0;
            if (0 < (int)uVar9) {
              uVar12 = 0;
              do {
                fVar23 = expf(*(float *)((long)pvVar13 + uVar12 * 4) - fVar24);
                *(float *)((long)pvVar13 + uVar12 * 4) = fVar23;
                fVar27 = fVar27 + fVar23;
                uVar12 = uVar12 + 1;
              } while (uVar19 != uVar12);
            }
            if (0 < (int)uVar9) {
              uVar12 = 0;
              do {
                *(float *)((long)pvVar13 + uVar12 * 4) =
                     *(float *)((long)pvVar13 + uVar12 * 4) * (1.0 / fVar27);
                uVar12 = uVar12 + 1;
              } while (uVar19 != uVar12);
            }
            lVar22 = lVar22 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar2 * (long)(int)uVar9);
          } while (lVar22 != iVar10);
        }
        goto LAB_0015519e;
      }
      uVar9 = uVar9 ^ 3;
      if (uVar9 == 0 && uVar18 == 0) {
        iVar10 = bottom_top_blob->w;
        iVar14 = bottom_top_blob->h;
        uVar9 = bottom_top_blob->c;
        uVar12 = (ulong)uVar9;
        uVar18 = iVar14 * iVar10;
        uVar19 = (ulong)uVar18;
        pAVar3 = opt->workspace_allocator;
        local_f8 = (void *)0x0;
        piVar1 = (int *)0x0;
        if (uVar18 != 0) {
          local_68 = CONCAT44(local_68._4_4_,iVar10);
          uVar15 = (long)(int)uVar18 * sVar2 + 3 & 0xfffffffffffffffc;
          if (pAVar3 == (Allocator *)0x0) {
            local_a8.data = (void *)0x0;
            iVar10 = posix_memalign(&local_a8.data,0x10,uVar15 + 4);
            if (iVar10 != 0) {
              local_a8.data = (void *)0x0;
            }
            local_f8 = local_a8.data;
          }
          else {
            local_f8 = (void *)(**(code **)(*(long *)pAVar3 + 0x10))();
          }
          piVar1 = (int *)((long)local_f8 + uVar15);
          *(undefined4 *)((long)local_f8 + uVar15) = 1;
          iVar10 = (int)local_68;
        }
        auVar8 = _DAT_0017b770;
        auVar7 = _DAT_0017b760;
        auVar6 = _DAT_0017aef0;
        iVar20 = -100;
        if ((local_f8 != (void *)0x0) && (uVar18 != 0)) {
          if (0 < (int)uVar18) {
            lVar22 = (ulong)uVar18 - 1;
            auVar26._8_4_ = (int)lVar22;
            auVar26._0_8_ = lVar22;
            auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
            uVar15 = 0;
            auVar26 = auVar26 ^ _DAT_0017aef0;
            do {
              auVar29._8_4_ = (int)uVar15;
              auVar29._0_8_ = uVar15;
              auVar29._12_4_ = (int)(uVar15 >> 0x20);
              auVar31 = (auVar29 | auVar8) ^ auVar6;
              iVar20 = auVar26._4_4_;
              if ((bool)(~(auVar31._4_4_ == iVar20 && auVar26._0_4_ < auVar31._0_4_ ||
                          iVar20 < auVar31._4_4_) & 1)) {
                *(undefined4 *)((long)local_f8 + uVar15 * 4) = 0xff7fffff;
              }
              if ((auVar31._12_4_ != auVar26._12_4_ || auVar31._8_4_ <= auVar26._8_4_) &&
                  auVar31._12_4_ <= auVar26._12_4_) {
                *(undefined4 *)((long)local_f8 + uVar15 * 4 + 4) = 0xff7fffff;
              }
              auVar31 = (auVar29 | auVar7) ^ auVar6;
              iVar32 = auVar31._4_4_;
              if (iVar32 <= iVar20 && (iVar32 != iVar20 || auVar31._0_4_ <= auVar26._0_4_)) {
                *(undefined4 *)((long)local_f8 + uVar15 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_f8 + uVar15 * 4 + 0xc) = 0xff7fffff;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar18 + 3 & 0xfffffffc) != uVar15);
          }
          if (0 < (int)uVar9) {
            pvVar13 = bottom_top_blob->data;
            sVar4 = bottom_top_blob->cstep;
            sVar5 = bottom_top_blob->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar17 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar13 + uVar17 * 4);
                  fVar24 = *(float *)((long)local_f8 + uVar17 * 4);
                  if (fVar27 <= fVar24) {
                    fVar27 = fVar24;
                  }
                  *(float *)((long)local_f8 + uVar17 * 4) = fVar27;
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              uVar15 = uVar15 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
            } while (uVar15 != uVar12);
          }
          local_a8.allocator = opt->workspace_allocator;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.refcount = (int *)0x0;
          local_a8.elempack = 1;
          local_a8.dims = 2;
          local_a8.c = 1;
          local_a8.cstep._4_4_ = (int)uVar18 >> 0x1f;
          local_a8.elemsize = sVar2;
          local_a8.w = iVar10;
          local_a8.h = iVar14;
          local_a8.cstep._0_4_ = uVar18;
          if (uVar18 != 0) {
            uVar15 = sVar2 * (long)(int)uVar18 + 3 & 0xfffffffffffffffc;
            if (local_a8.allocator == (Allocator *)0x0) {
              local_60 = (void *)0x0;
              iVar10 = posix_memalign(&local_60,0x10,uVar15 + 4);
              local_a8.data = local_60;
              if (iVar10 != 0) {
                local_60 = (void *)0x0;
                local_a8.data = local_60;
              }
            }
            else {
              local_a8.data =
                   (void *)(**(code **)(*(long *)local_a8.allocator + 0x10))(local_a8.allocator);
            }
            local_a8.refcount = (int *)((long)local_a8.data + uVar15);
            *(undefined4 *)((long)local_a8.data + uVar15) = 1;
          }
          iVar20 = -100;
          if ((local_a8.data != (void *)0x0) &&
             ((long)local_a8.c * CONCAT44(local_a8.cstep._4_4_,(uint)local_a8.cstep) != 0)) {
            if (0 < (int)(local_a8.c * (uint)local_a8.cstep)) {
              memset(local_a8.data,0,(ulong)(local_a8.c * (uint)local_a8.cstep) << 2);
            }
            pvVar13 = local_a8.data;
            if (0 < (int)uVar9) {
              sVar2 = bottom_top_blob->cstep;
              sVar4 = bottom_top_blob->elemsize;
              pvVar16 = bottom_top_blob->data;
              uVar15 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar17 = 0;
                  do {
                    fVar24 = expf(*(float *)((long)pvVar16 + uVar17 * 4) -
                                  *(float *)((long)local_f8 + uVar17 * 4));
                    *(float *)((long)pvVar16 + uVar17 * 4) = fVar24;
                    *(float *)((long)pvVar13 + uVar17 * 4) =
                         fVar24 + *(float *)((long)pvVar13 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar19 != uVar17);
                }
                uVar15 = uVar15 + 1;
                pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar4);
              } while (uVar15 != uVar12);
            }
            if ((int)uVar9 < 1) {
              iVar20 = 0;
            }
            else {
              pvVar13 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar4 = bottom_top_blob->elemsize;
              uVar15 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar17 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar17 * 4) =
                         *(float *)((long)pvVar13 + uVar17 * 4) /
                         *(float *)((long)local_a8.data + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar19 != uVar17);
                }
                uVar15 = uVar15 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar4);
              } while (uVar15 != uVar12);
              iVar20 = 0;
            }
          }
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + -1;
            UNLOCK();
            if (*local_a8.refcount == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_a8.allocator + 0x18))();
              }
            }
          }
          local_a8.elemsize = 0;
          local_a8.elempack = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.dims = 0;
          local_a8.w = 0;
          local_a8.h = 0;
          local_a8.c = 0;
          local_a8.cstep._0_4_ = 0;
          local_a8.cstep._4_4_ = 0;
        }
        if (piVar1 == (int *)0x0) {
          return iVar20;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return iVar20;
        }
        if (pAVar3 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar3 + 0x18))();
          return iVar20;
        }
      }
      else {
        if ((uVar18 ^ 1) != 0 || uVar9 != 0) {
          if (uVar9 != 0 || uVar18 != 2) {
            return 0;
          }
          local_58 = (void *)(long)bottom_top_blob->c;
          if ((long)local_58 < 1) {
            return 0;
          }
          uVar9 = bottom_top_blob->w;
          uVar19 = (ulong)uVar9;
          iVar10 = bottom_top_blob->h;
          local_b0 = bottom_top_blob->data;
          local_50 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          local_68 = 0;
          do {
            if (0 < iVar10) {
              iVar20 = 0;
              pvVar13 = local_b0;
              do {
                fVar24 = -3.4028235e+38;
                if (0 < (int)uVar9) {
                  uVar12 = 0;
                  fVar24 = -3.4028235e+38;
                  do {
                    fVar27 = *(float *)((long)pvVar13 + uVar12 * 4);
                    if (fVar24 <= fVar27) {
                      fVar24 = fVar27;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar19 != uVar12);
                }
                fVar27 = 0.0;
                if (0 < (int)uVar9) {
                  uVar12 = 0;
                  do {
                    fVar23 = expf(*(float *)((long)pvVar13 + uVar12 * 4) - fVar24);
                    *(float *)((long)pvVar13 + uVar12 * 4) = fVar23;
                    fVar27 = fVar27 + fVar23;
                    uVar12 = uVar12 + 1;
                  } while (uVar19 != uVar12);
                }
                if (0 < (int)uVar9) {
                  uVar12 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar12 * 4) =
                         *(float *)((long)pvVar13 + uVar12 * 4) * (1.0 / fVar27);
                    uVar12 = uVar12 + 1;
                  } while (uVar19 != uVar12);
                }
                iVar20 = iVar20 + 1;
                pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar9 * 4);
              } while (iVar20 != iVar10);
            }
            local_68 = local_68 + 1;
            local_b0 = (void *)((long)local_b0 + local_50);
          } while ((void *)local_68 != local_58);
          return 0;
        }
        uVar9 = bottom_top_blob->w;
        uVar19 = (ulong)uVar9;
        iVar10 = bottom_top_blob->h;
        local_68 = (ulong)(uint)bottom_top_blob->c;
        pAVar3 = opt->workspace_allocator;
        local_f8 = (void *)0x0;
        piVar1 = (int *)0x0;
        uVar18 = bottom_top_blob->c * uVar9;
        if (uVar18 != 0) {
          uVar12 = (long)(int)uVar18 * sVar2 + 3 & 0xfffffffffffffffc;
          if (pAVar3 == (Allocator *)0x0) {
            local_a8.data = (void *)0x0;
            iVar20 = posix_memalign(&local_a8.data,0x10,uVar12 + 4);
            local_f8 = local_a8.data;
            if (iVar20 != 0) {
              local_a8.data = (void *)0x0;
              local_f8 = local_a8.data;
            }
          }
          else {
            local_f8 = (void *)(**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,uVar12 + 4);
          }
          piVar1 = (int *)((long)local_f8 + uVar12);
          *(undefined4 *)((long)local_f8 + uVar12) = 1;
        }
        auVar8 = _DAT_0017b770;
        auVar7 = _DAT_0017b760;
        auVar6 = _DAT_0017aef0;
        iVar20 = -100;
        if ((local_f8 != (void *)0x0) && (uVar18 != 0)) {
          if (0 < (int)uVar18) {
            lVar22 = (ulong)uVar18 - 1;
            auVar31._8_4_ = (int)lVar22;
            auVar31._0_8_ = lVar22;
            auVar31._12_4_ = (int)((ulong)lVar22 >> 0x20);
            uVar12 = 0;
            auVar31 = auVar31 ^ _DAT_0017aef0;
            do {
              auVar30._8_4_ = (int)uVar12;
              auVar30._0_8_ = uVar12;
              auVar30._12_4_ = (int)(uVar12 >> 0x20);
              auVar26 = (auVar30 | auVar8) ^ auVar6;
              iVar20 = auVar31._4_4_;
              if ((bool)(~(auVar26._4_4_ == iVar20 && auVar31._0_4_ < auVar26._0_4_ ||
                          iVar20 < auVar26._4_4_) & 1)) {
                *(undefined4 *)((long)local_f8 + uVar12 * 4) = 0xff7fffff;
              }
              if ((auVar26._12_4_ != auVar31._12_4_ || auVar26._8_4_ <= auVar31._8_4_) &&
                  auVar26._12_4_ <= auVar31._12_4_) {
                *(undefined4 *)((long)local_f8 + uVar12 * 4 + 4) = 0xff7fffff;
              }
              auVar30 = (auVar30 | auVar7) ^ auVar6;
              iVar14 = auVar30._4_4_;
              if (iVar14 <= iVar20 && (iVar14 != iVar20 || auVar30._0_4_ <= auVar31._0_4_)) {
                *(undefined4 *)((long)local_f8 + uVar12 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_f8 + uVar12 * 4 + 0xc) = 0xff7fffff;
              }
              uVar12 = uVar12 + 4;
            } while ((uVar18 + 3 & 0xfffffffc) != uVar12);
          }
          lVar22 = (long)(int)uVar9;
          iVar14 = (int)local_68;
          if (0 < iVar14) {
            pvVar13 = bottom_top_blob->data;
            sVar4 = bottom_top_blob->cstep;
            sVar5 = bottom_top_blob->elemsize;
            uVar12 = 0;
            pvVar16 = local_f8;
            do {
              if (0 < iVar10) {
                iVar20 = 0;
                pvVar21 = pvVar13;
                do {
                  if (0 < (int)uVar9) {
                    uVar15 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar21 + uVar15 * 4);
                      fVar24 = *(float *)((long)pvVar16 + uVar15 * 4);
                      if (fVar27 <= fVar24) {
                        fVar27 = fVar24;
                      }
                      *(float *)((long)pvVar16 + uVar15 * 4) = fVar27;
                      uVar15 = uVar15 + 1;
                    } while (uVar19 != uVar15);
                  }
                  iVar20 = iVar20 + 1;
                  pvVar21 = (void *)((long)pvVar21 + lVar22 * 4);
                } while (iVar20 != iVar10);
              }
              uVar12 = uVar12 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
              pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar9 * sVar2);
            } while (uVar12 != local_68);
          }
          local_a8.elemsize = 0;
          local_a8.elempack = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.allocator = (Allocator *)0x0;
          local_a8.dims = 0;
          local_a8.w = 0;
          local_a8.h = 0;
          local_a8.c = 0;
          local_a8.cstep._0_4_ = 0;
          local_a8.cstep._4_4_ = 0;
          Mat::create(&local_a8,uVar9,iVar14,sVar2,opt->workspace_allocator);
          iVar20 = -100;
          if ((local_a8.data != (void *)0x0) &&
             ((long)local_a8.c * CONCAT44(local_a8.cstep._4_4_,(uint)local_a8.cstep) != 0)) {
            local_48 = lVar22;
            if (0 < (int)(local_a8.c * (uint)local_a8.cstep)) {
              memset(local_a8.data,0,(ulong)(local_a8.c * (uint)local_a8.cstep) << 2);
            }
            if (0 < iVar14) {
              local_58 = bottom_top_blob->data;
              local_38 = (long)(int)uVar9 * sVar2;
              local_40 = (long)local_a8.w * local_a8.elemsize;
              local_50 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
              lVar22 = local_48 * 4;
              uVar12 = 0;
              pvVar13 = local_a8.data;
              pvVar16 = local_f8;
              do {
                if (0 < iVar10) {
                  iVar20 = 0;
                  pvVar21 = local_58;
                  do {
                    if (0 < (int)uVar9) {
                      uVar15 = 0;
                      do {
                        fVar24 = expf(*(float *)((long)pvVar21 + uVar15 * 4) -
                                      *(float *)((long)pvVar16 + uVar15 * 4));
                        *(float *)((long)pvVar21 + uVar15 * 4) = fVar24;
                        *(float *)((long)pvVar13 + uVar15 * 4) =
                             fVar24 + *(float *)((long)pvVar13 + uVar15 * 4);
                        uVar15 = uVar15 + 1;
                      } while (uVar19 != uVar15);
                    }
                    iVar20 = iVar20 + 1;
                    pvVar21 = (void *)((long)pvVar21 + lVar22);
                  } while (iVar20 != iVar10);
                }
                uVar12 = uVar12 + 1;
                pvVar13 = (void *)((long)pvVar13 + local_40);
                pvVar16 = (void *)((long)pvVar16 + local_38);
                local_58 = (void *)((long)local_58 + local_50);
              } while (uVar12 != local_68);
            }
            if ((int)local_68 < 1) {
              iVar20 = 0;
            }
            else {
              pvVar13 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar4 = bottom_top_blob->elemsize;
              uVar12 = 0;
              pvVar16 = local_a8.data;
              do {
                if (0 < iVar10) {
                  iVar20 = 0;
                  pvVar21 = pvVar13;
                  do {
                    if (0 < (int)uVar9) {
                      uVar15 = 0;
                      do {
                        *(float *)((long)pvVar21 + uVar15 * 4) =
                             *(float *)((long)pvVar21 + uVar15 * 4) /
                             *(float *)((long)pvVar16 + uVar15 * 4);
                        uVar15 = uVar15 + 1;
                      } while (uVar19 != uVar15);
                    }
                    iVar20 = iVar20 + 1;
                    pvVar21 = (void *)((long)pvVar21 + local_48 * 4);
                  } while (iVar20 != iVar10);
                }
                uVar12 = uVar12 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar4);
                pvVar16 = (void *)((long)pvVar16 + (long)local_a8.w * local_a8.elemsize);
              } while (uVar12 != local_68);
              iVar20 = 0;
            }
          }
          Mat::~Mat(&local_a8);
        }
        if (piVar1 == (int *)0x0) {
          return iVar20;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return iVar20;
        }
        if (pAVar3 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar3 + 0x18))();
          return iVar20;
        }
      }
    }
    if (local_f8 != (void *)0x0) {
      free(local_f8);
    }
  }
  return iVar20;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
                s += ptr[j];
            }

            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                    sum += ptr[j];
                }

                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}